

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImageRounded
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col,float rounding,int rounding_corners)

{
  bool bVar1;
  void **ppvVar2;
  ImDrawList *in_RCX;
  void *in_RSI;
  ImVec2 *in_RDI;
  ImTextureID in_R8;
  ImVec2 *in_R9;
  float in_XMM0_Da;
  uint in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  float in_stack_0000001c;
  ImVec2 *in_stack_00000020;
  int vert_end_idx;
  int vert_start_idx;
  undefined4 in_stack_00000030;
  bool push_texture_id;
  ImVec2 *in_stack_00000068;
  undefined4 in_stack_00000074;
  int in_stack_0000007c;
  ImDrawList *in_stack_00000080;
  ImVec2 *in_stack_00000090;
  ImTextureID in_stack_ffffffffffffff98;
  ImU32 col_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  bool local_49;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  
  if ((in_stack_00000008 & 0xff000000) != 0) {
    if ((in_XMM0_Da <= 0.0) || ((in_stack_00000010 & 0xf) == 0)) {
      AddImage(in_RCX,in_R8,in_R9,(ImVec2 *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,
               (ImU32)in_RSI);
    }
    else {
      bVar1 = ImVector<void_*>::empty((ImVector<void_*> *)(in_RDI + 0xe));
      local_49 = true;
      if (!bVar1) {
        ppvVar2 = ImVector<void_*>::back((ImVector<void_*> *)(in_RDI + 0xe));
        local_49 = in_RSI != *ppvVar2;
      }
      uVar4 = (uint)local_49 << 0x18;
      if (local_49 != false) {
        PushTextureID((ImDrawList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      }
      col_00 = (ImU32)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      PathRect((ImDrawList *)CONCAT44(rounding,in_stack_00000030),_vert_end_idx,in_stack_00000020,
               in_stack_0000001c,in_stack_00000018);
      PathFillConvex((ImDrawList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     col_00);
      uVar3 = 1;
      ImGui::ShadeVertsLinearUV
                (in_stack_00000080,in_stack_0000007c,rounding_corners,
                 (ImVec2 *)CONCAT44(in_stack_00000074,col),in_stack_00000068,(ImVec2 *)this,
                 in_stack_00000090,user_texture_id._7_1_);
      if ((uVar4 & 0x1000000) != 0) {
        PopTextureID((ImDrawList *)CONCAT44(in_stack_ffffffffffffffa4,uVar3));
      }
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImageRounded(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col, float rounding, int rounding_corners)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (rounding <= 0.0f || (rounding_corners & ImDrawCornerFlags_All) == 0)
    {
        AddImage(user_texture_id, a, b, uv_a, uv_b, col);
        return;
    }

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    int vert_start_idx = VtxBuffer.Size;
    PathRect(a, b, rounding, rounding_corners);
    PathFillConvex(col);
    int vert_end_idx = VtxBuffer.Size;
    ImGui::ShadeVertsLinearUV(this, vert_start_idx, vert_end_idx, a, b, uv_a, uv_b, true);

    if (push_texture_id)
        PopTextureID();
}